

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,return_statement *s)

{
  expression *peVar1;
  value local_a8;
  value local_80;
  undefined1 local_48 [8];
  value res;
  return_statement *s_local;
  impl *this_local;
  
  res.field_1._24_8_ = s;
  value::value((value *)local_48);
  peVar1 = return_statement::e((return_statement *)res.field_1._24_8_);
  if (peVar1 != (expression *)0x0) {
    peVar1 = return_statement::e((return_statement *)res.field_1._24_8_);
    eval(&local_a8,this,peVar1);
    get_value(&local_80,this,&local_a8);
    value::operator=((value *)local_48,&local_80);
    value::~value(&local_80);
    value::~value(&local_a8);
  }
  completion::completion(__return_storage_ptr__,(value *)local_48,return_);
  value::~value((value *)local_48);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const return_statement& s) {
        value res{};
        if (s.e()) {
            res = get_value(eval(*s.e()));
        }
        return completion{res, completion_type::return_};
    }